

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void doctest::anon_unknown_14::FatalConditionHandler::handleSignal(int sig)

{
  int *piVar1;
  pointer ppIVar2;
  IReporter *pIVar3;
  ContextState *pCVar4;
  long lVar5;
  long lVar6;
  pointer pSVar7;
  pointer ppIVar8;
  IReporter **curr_rep;
  char *__s;
  allocator<char> local_71;
  char *local_70 [4];
  String local_50;
  undefined1 local_38;
  
  __s = "<unknown signal>";
  lVar5 = 0;
  do {
    lVar6 = lVar5;
    if (lVar6 + 0x10 == 0x70) goto LAB_00113907;
    lVar5 = lVar6 + 0x10;
  } while (*(int *)((long)&(anonymous_namespace)::signalDefs + lVar6) != sig);
  __s = *(char **)((long)&PTR_anon_var_dwarf_292f2_0013b848 + lVar6);
LAB_00113907:
  reset();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,__s,&local_71);
  pCVar4 = detail::g_cs;
  piVar1 = &(detail::g_cs->super_CurrentTestCaseStats).failure_flags;
  *piVar1 = *piVar1 | 4;
  ppIVar2 = (pCVar4->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar8 = (pCVar4->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar2; ppIVar8 = ppIVar8 + 1
      ) {
    pIVar3 = *ppIVar8;
    String::String(&local_50,local_70[0]);
    local_38 = 1;
    (*pIVar3->_vptr_IReporter[6])(pIVar3,&local_50);
    String::~String(&local_50);
  }
  while( true ) {
    pSVar7 = (detail::g_cs->subcasesStack).
             super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar7 == (detail::g_cs->subcasesStack).
                  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                  ._M_impl.super__Vector_impl_data._M_start) break;
    pSVar7 = pSVar7 + -1;
    (detail::g_cs->subcasesStack).
    super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar7;
    String::~String(&pSVar7->m_name);
    ppIVar2 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar8 = (detail::g_cs->reporters_currently_used).
                   super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar2;
        ppIVar8 = ppIVar8 + 1) {
      (*(*ppIVar8)->_vptr_IReporter[8])();
    }
  }
  detail::ContextState::finalizeTestCaseData(detail::g_cs);
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar8 = (detail::g_cs->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar2; ppIVar8 = ppIVar8 + 1
      ) {
    (*(*ppIVar8)->_vptr_IReporter[5])(*ppIVar8,&detail::g_cs->super_CurrentTestCaseStats);
  }
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar8 = (detail::g_cs->reporters_currently_used).
                 super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppIVar8 != ppIVar2; ppIVar8 = ppIVar8 + 1
      ) {
    (*(*ppIVar8)->_vptr_IReporter[2])(*ppIVar8,&detail::g_cs->super_TestRunStats);
  }
  std::__cxx11::string::~string((string *)local_70);
  raise(sig);
  return;
}

Assistant:

static void handleSignal(int sig) {
            const char* name = "<unknown signal>";
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                SignalDefs& def = signalDefs[i];
                if(sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise(sig);
        }